

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

Slice __thiscall
leveldb::anon_unknown_0::RandomGenerator::Generate(RandomGenerator *this,size_t len)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int local_28;
  size_t len_local;
  RandomGenerator *this_local;
  
  iVar1 = this->pos_;
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < (long)iVar1 + len) {
    this->pos_ = 0;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= len) {
      __assert_fail("len < data_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench.cc"
                    ,0x91,"Slice leveldb::(anonymous namespace)::RandomGenerator::Generate(size_t)")
      ;
    }
  }
  local_28 = (int)len;
  this->pos_ = this->pos_ + local_28;
  lVar3 = std::__cxx11::string::data();
  Slice::Slice((Slice *)&this_local,(char *)((lVar3 + this->pos_) - len),len);
  return _this_local;
}

Assistant:

Slice Generate(size_t len) {
    if (pos_ + len > data_.size()) {
      pos_ = 0;
      assert(len < data_.size());
    }
    pos_ += len;
    return Slice(data_.data() + pos_ - len, len);
  }